

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall cmListFileParser::ParseFile(cmListFileParser *this)

{
  bool bVar1;
  int iVar2;
  cmListFileLexer_Token *pcVar3;
  char *pcVar4;
  size_t sVar5;
  cmListFileLexer_BOM bom;
  ostringstream error;
  undefined1 auStack_1d8 [4];
  cmListFileLexer_BOM local_1d4;
  string local_1d0;
  value_type *local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  iVar2 = cmListFileLexer_SetFileName(this->Lexer,this->FileName,&local_1d4);
  if (iVar2 == 0) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"cmListFileCache: error can not open file.","");
    cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,local_1a8,&this->Backtrace);
  }
  else if (local_1d4 == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Error while reading Byte-Order-Mark. File not seekable?","");
    cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,local_1a8,&this->Backtrace);
  }
  else {
    if ((local_1d4 & ~cmListFileLexer_BOM_UTF8) == cmListFileLexer_BOM_None) {
      local_1b0 = &this->Function;
      bVar1 = true;
      do {
        pcVar3 = cmListFileLexer_Scan(this->Lexer);
        if (pcVar3 == (cmListFileLexer_Token *)0x0) {
          iVar2 = 3;
          goto switchD_0020d7ed_caseD_1;
        }
        iVar2 = 0;
        switch(pcVar3->type) {
        case cmListFileLexer_Token_Space:
          break;
        case cmListFileLexer_Token_Newline:
          bVar1 = true;
          iVar2 = 0;
          break;
        case cmListFileLexer_Token_Identifier:
          if (bVar1) {
            bVar1 = ParseFunction(this,pcVar3->text,(long)pcVar3->line,(long)pcVar3->column);
            iVar2 = 0;
            if (bVar1) {
              std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
                        (&this->ListFile->Functions,local_1b0);
            }
            else {
              iVar2 = 1;
            }
            goto LAB_0020d98b;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Parse error.  Expected a newline, got ",0x26);
          pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)auStack_1d8 +
                            (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x30);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," with text \"",0xc);
          pcVar4 = pcVar3->text;
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)auStack_1d8 +
                            (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x30);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
          std::__cxx11::stringbuf::str();
          IssueError(this,&local_1d0);
          goto LAB_0020da31;
        default:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Parse error.  Expected a command name, got ",0x2b);
          pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)auStack_1d8 +
                            (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x30);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," with text \"",0xc);
          pcVar4 = pcVar3->text;
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)auStack_1d8 +
                            (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x30);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
          std::__cxx11::stringbuf::str();
          IssueError(this,&local_1d0);
LAB_0020da31:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          iVar2 = 1;
          break;
        case cmListFileLexer_Token_CommentBracket:
          iVar2 = 0;
LAB_0020d98b:
          bVar1 = false;
        }
switchD_0020d7ed_caseD_1:
        if (iVar2 != 0) {
          if (iVar2 != 3) {
            return false;
          }
          return true;
        }
      } while( true );
    }
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"File starts with a Byte-Order-Mark that is not UTF-8.","");
    cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,local_1a8,&this->Backtrace);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmListFileParser::ParseFile()
{
  // Open the file.
  cmListFileLexer_BOM bom;
  if (!cmListFileLexer_SetFileName(this->Lexer, this->FileName, &bom)) {
    this->IssueFileOpenError("cmListFileCache: error can not open file.");
    return false;
  }

  if (bom == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer, nullptr, nullptr);
    this->IssueFileOpenError("Error while reading Byte-Order-Mark. "
                             "File not seekable?");
    return false;
  }

  // Verify the Byte-Order-Mark, if any.
  if (bom != cmListFileLexer_BOM_None && bom != cmListFileLexer_BOM_UTF8) {
    cmListFileLexer_SetFileName(this->Lexer, nullptr, nullptr);
    this->IssueFileOpenError(
      "File starts with a Byte-Order-Mark that is not UTF-8.");
    return false;
  }

  // Use a simple recursive-descent parser to process the token
  // stream.
  bool haveNewline = true;
  while (cmListFileLexer_Token* token = cmListFileLexer_Scan(this->Lexer)) {
    if (token->type == cmListFileLexer_Token_Space) {
    } else if (token->type == cmListFileLexer_Token_Newline) {
      haveNewline = true;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      haveNewline = false;
    } else if (token->type == cmListFileLexer_Token_Identifier) {
      if (haveNewline) {
        haveNewline = false;
        if (this->ParseFunction(token->text, token->line, token->column)) {
          this->ListFile->Functions.push_back(this->Function);
        } else {
          return false;
        }
      } else {
        std::ostringstream error;
        error << "Parse error.  Expected a newline, got "
              << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
              << " with text \"" << token->text << "\".";
        this->IssueError(error.str());
        return false;
      }
    } else {
      std::ostringstream error;
      error << "Parse error.  Expected a command name, got "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }
  return true;
}